

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool unplugGroup(QMainWindowLayout *layout,QLayoutItem **item,QDockAreaLayoutItem *parentItem)

{
  long lVar1;
  undefined8 uVar2;
  QDockWidgetGroupWindow *this;
  QDockAreaLayoutInfo *pQVar3;
  void *pvVar4;
  QRect *in_RDX;
  int __sig;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *info;
  QDockWidgetGroupWindow *floatingTabs;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff90;
  QRect *this_00;
  QDockWidgetGroupWindow *this_01;
  QWidget *in_stack_ffffffffffffffa0;
  QMainWindowLayout *in_stack_ffffffffffffffb0;
  bool local_21;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1._0_4_ = in_RDX->x2;
  lVar1._4_4_ = in_RDX->y2;
  if ((lVar1 == 0) || ((*(byte *)(*(long *)&in_RDX->x2 + 0x58) & 1) == 0)) {
    local_21 = false;
  }
  else {
    this = QMainWindowLayout::createTabbedDockWindow(in_stack_ffffffffffffffb0);
    pQVar3 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fbd4f);
    QDockAreaLayoutInfo::operator=
              (in_stack_ffffffffffffff90,
               (QDockAreaLayoutInfo *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
    ;
    pvVar4 = *(void **)&in_RDX->x2;
    if (pvVar4 != (void *)0x0) {
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_stack_ffffffffffffff90);
      operator_delete(pvVar4,0x70);
    }
    in_RDX->x2 = 0;
    in_RDX->y2 = 0;
    this_00 = &pQVar3->rect;
    this_01 = this;
    QLayout::parentWidget((QLayout *)in_stack_ffffffffffffffa0);
    QWidget::pos(&this_01->super_QWidget);
    local_18 = QRect::translated((QRect *)in_RSI,(QPoint *)in_RDX);
    __sig = (int)&local_18;
    QWidget::setGeometry(in_RSI,in_RDX);
    QWidget::show(in_stack_ffffffffffffffa0);
    QWidget::raise(&this->super_QWidget,__sig);
    pvVar4 = operator_new(0x18);
    QDockWidgetGroupWindowItem::QDockWidgetGroupWindowItem
              ((QDockWidgetGroupWindowItem *)this_00,
               (QDockWidgetGroupWindow *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    *(void **)in_RSI = pvVar4;
    uVar2 = *(undefined8 *)in_RSI;
    in_RDX->x1 = (Representation)(int)uVar2;
    in_RDX->y1 = (Representation)(int)((ulong)uVar2 >> 0x20);
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

static bool unplugGroup(QMainWindowLayout *layout, QLayoutItem **item,
                        QDockAreaLayoutItem &parentItem)
{
    if (!parentItem.subinfo || !parentItem.subinfo->tabbed)
        return false;

    // The QDockWidget is part of a group of tab and we need to unplug them all.
    QDockWidgetGroupWindow *floatingTabs = layout->createTabbedDockWindow();
    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
    *info = std::move(*parentItem.subinfo);
    delete parentItem.subinfo;
    parentItem.subinfo = nullptr;
    floatingTabs->setGeometry(info->rect.translated(layout->parentWidget()->pos()));
    floatingTabs->show();
    floatingTabs->raise();
    *item = new QDockWidgetGroupWindowItem(floatingTabs);
    parentItem.widgetItem = *item;
    return true;
}